

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O3

void keccakf(void *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong local_110;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  
  uVar3 = *state;
  local_c0 = *(ulong *)((long)state + 8);
  local_f0 = *(ulong *)((long)state + 0x28);
  uVar6 = *(ulong *)((long)state + 0x50);
  uVar5 = *(ulong *)((long)state + 0x78);
  local_a8 = *(ulong *)((long)state + 0xa0);
  uVar13 = *(ulong *)((long)state + 0x30);
  local_e8 = *(ulong *)((long)state + 0x58);
  uVar20 = *(ulong *)((long)state + 0x80);
  local_d8 = *(ulong *)((long)state + 0xa8);
  local_b8 = *(ulong *)((long)state + 0x10);
  uVar25 = *(ulong *)((long)state + 0x38);
  uVar30 = *(ulong *)((long)state + 0x60);
  uVar15 = *(ulong *)((long)state + 0x88);
  local_a0 = *(ulong *)((long)state + 0xb0);
  local_f8 = *(ulong *)((long)state + 0x18);
  uVar2 = *(ulong *)((long)state + 0x40);
  local_100 = *(ulong *)((long)state + 0x68);
  local_b0 = *(ulong *)((long)state + 0x90);
  local_d0 = *(ulong *)((long)state + 0xb8);
  local_c8 = *(ulong *)((long)state + 0x20);
  local_98 = *(ulong *)((long)state + 0x48);
  uVar7 = *(ulong *)((long)state + 0x70);
  uVar21 = *(ulong *)((long)state + 0x98);
  local_110 = *(ulong *)((long)state + 0xc0);
  lVar8 = 0;
  do {
    uVar1 = uVar6 ^ uVar5 ^ local_f0 ^ uVar3 ^ local_a8;
    uVar22 = local_e8 ^ uVar20 ^ uVar13 ^ local_c0 ^ local_d8;
    uVar16 = local_100 ^ local_b0 ^ uVar2 ^ local_f8 ^ local_d0;
    uVar4 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar22;
    uVar9 = uVar7 ^ uVar21 ^ local_98 ^ local_c8 ^ local_110;
    uVar23 = (uVar22 << 1 | (ulong)((long)uVar22 < 0)) ^ uVar9;
    uVar3 = uVar3 ^ uVar23;
    uVar22 = local_f0 ^ uVar23;
    uVar24 = uVar23 ^ local_a8;
    uVar17 = uVar30 ^ uVar15 ^ uVar25 ^ local_b8 ^ local_a0;
    uVar10 = (uVar9 << 1 | (ulong)((long)uVar9 < 0)) ^ uVar17;
    uVar18 = (uVar17 << 1 | (ulong)((long)uVar17 < 0)) ^ uVar1;
    uVar14 = local_c0 ^ uVar18;
    uVar9 = uVar25 ^ uVar4;
    uVar17 = uVar4 ^ local_a0;
    uVar11 = uVar10 ^ local_d0;
    uVar16 = (uVar1 << 1 | (ulong)((long)uVar1 < 0)) ^ uVar16;
    uVar1 = local_c8 ^ uVar16;
    uVar28 = (local_b0 ^ uVar10) << 0x15 | (local_b0 ^ uVar10) >> 0x2b;
    uVar26 = (uVar2 ^ uVar10) << 0x37 | (uVar2 ^ uVar10) >> 9;
    uVar19 = (uVar18 ^ local_d8) << 2 | (uVar18 ^ local_d8) >> 0x3e;
    local_c8 = (uVar16 ^ local_110) << 0xe | (uVar16 ^ local_110) >> 0x32;
    local_d0 = (uVar5 ^ uVar23) << 0x29 | (uVar5 ^ uVar23) >> 0x17;
    uVar29 = (uVar30 ^ uVar4) << 0x2b | (uVar30 ^ uVar4) >> 0x15;
    uVar27 = (local_b8 ^ uVar4) << 0x3e | (local_b8 ^ uVar4) >> 2;
    uVar5 = (uVar7 ^ uVar16) << 0x27 | (uVar7 ^ uVar16) >> 0x19;
    uVar12 = (uVar13 ^ uVar18) << 0x2c | (uVar13 ^ uVar18) >> 0x14;
    local_b8 = ~uVar28 & local_c8 ^ uVar29;
    local_c0 = ~uVar29 & uVar28 ^ uVar12;
    local_a8 = ~uVar26 & uVar5 ^ uVar27;
    local_a0 = ~local_d0 & uVar19 ^ uVar5;
    local_d8 = ~uVar5 & local_d0 ^ uVar26;
    uVar25 = (uVar6 ^ uVar23) << 3 | (uVar6 ^ uVar23) >> 0x3d;
    uVar5 = (local_f8 ^ uVar10) << 0x1c | (local_f8 ^ uVar10) >> 0x24;
    uVar2 = (uVar20 ^ uVar18) << 0x2d | (uVar20 ^ uVar18) >> 0x13;
    uVar6 = uVar17 << 0x3d | uVar17 >> 3;
    uVar20 = (local_98 ^ uVar16) << 0x14 | (local_98 ^ uVar16) >> 0x2c;
    local_f0 = ~uVar20 & uVar25 ^ uVar5;
    uVar13 = ~uVar25 & uVar2 ^ uVar20;
    local_f8 = ~local_c8 & uVar3 ^ uVar28;
    local_c8 = ~uVar3 & uVar12 ^ local_c8;
    uVar25 = ~uVar2 & uVar6 ^ uVar25;
    uVar2 = ~uVar6 & uVar5 ^ uVar2;
    local_98 = uVar20 & ~uVar5 ^ uVar6;
    local_d0 = ~uVar19 & uVar27 ^ local_d0;
    uVar20 = (local_e8 ^ uVar18) << 10 | (local_e8 ^ uVar18) >> 0x36;
    uVar4 = (uVar15 ^ uVar4) << 0xf | (uVar15 ^ uVar4) >> 0x31;
    uVar17 = uVar22 << 0x24 | uVar22 >> 0x1c;
    uVar1 = uVar1 << 0x1b | uVar1 >> 0x25;
    uVar22 = uVar11 << 0x38 | uVar11 >> 8;
    local_b0 = ~uVar22 & uVar1 ^ uVar4;
    uVar15 = ~uVar4 & uVar22 ^ uVar20;
    uVar11 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
    uVar9 = uVar9 << 6 | uVar9 >> 0x3a;
    uVar5 = (uVar21 ^ uVar16) << 8 | (uVar21 ^ uVar16) >> 0x38;
    uVar21 = (local_100 ^ uVar10) << 0x19 | (local_100 ^ uVar10) >> 0x27;
    uVar7 = uVar24 << 0x12 | uVar24 >> 0x2e;
    uVar30 = ~uVar5 & uVar7 ^ uVar21;
    local_100 = ~uVar7 & uVar11 ^ uVar5;
    uVar6 = ~uVar9 & uVar21 ^ uVar11;
    local_e8 = ~uVar21 & uVar5 ^ uVar9;
    uVar7 = ~uVar11 & uVar9 ^ uVar7;
    uVar5 = ~uVar17 & uVar20 ^ uVar1;
    uVar20 = ~uVar20 & uVar4 ^ uVar17;
    uVar21 = ~uVar1 & uVar17 ^ uVar22;
    local_110 = ~uVar27 & uVar26 ^ uVar19;
    uVar3 = ~uVar12 & uVar29 ^ *(ulong *)((long)RC + lVar8) ^ uVar3;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0xc0);
  *(ulong *)state = uVar3;
  *(ulong *)((long)state + 0x28) = local_f0;
  *(ulong *)((long)state + 0x50) = uVar6;
  *(ulong *)((long)state + 0x78) = uVar5;
  *(ulong *)((long)state + 0xa0) = local_a8;
  *(ulong *)((long)state + 8) = local_c0;
  *(ulong *)((long)state + 0x30) = uVar13;
  *(ulong *)((long)state + 0x58) = local_e8;
  *(ulong *)((long)state + 0x80) = uVar20;
  *(ulong *)((long)state + 0xa8) = local_d8;
  *(ulong *)((long)state + 0x10) = local_b8;
  *(ulong *)((long)state + 0x38) = uVar25;
  *(ulong *)((long)state + 0x60) = uVar30;
  *(ulong *)((long)state + 0x88) = uVar15;
  *(ulong *)((long)state + 0xb0) = local_a0;
  *(ulong *)((long)state + 0x18) = local_f8;
  *(ulong *)((long)state + 0x40) = uVar2;
  *(ulong *)((long)state + 0x68) = local_100;
  *(ulong *)((long)state + 0x90) = local_b0;
  *(ulong *)((long)state + 0xb8) = local_d0;
  *(ulong *)((long)state + 0x20) = local_c8;
  *(ulong *)((long)state + 0x48) = local_98;
  *(ulong *)((long)state + 0x70) = uVar7;
  *(ulong *)((long)state + 0x98) = uVar21;
  *(ulong *)((long)state + 0xc0) = local_110;
  return;
}

Assistant:

static inline void keccakf(void* state) {
  uint64_t* a = (uint64_t*)state;
  uint64_t b[5] = {0};
  uint64_t t = 0;
  uint8_t x, y;

  for (int i = 0; i < 24; i++) {
    // Theta
    FOR5(x, 1, b[x] = 0; FOR5(y, 5, b[x] ^= a[x + y];))
    FOR5(x, 1, FOR5(y, 5, a[y + x] ^= b[(x + 4) % 5] ^ rol(b[(x + 1) % 5], 1);))
    // Rho and pi
    t = a[1];
    x = 0;
    REPEAT24(b[0] = a[pi[x]]; a[pi[x]] = rol(t, rho[x]); t = b[0]; x++;)
    // Chi
    FOR5(y, 5,
         FOR5(x, 1, b[x] = a[y + x];) FOR5(
             x, 1, a[y + x] = b[x] ^ ((~b[(x + 1) % 5]) & b[(x + 2) % 5]);))
    // Iota
    a[0] ^= RC[i];
  }
}